

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O1

int __thiscall MatchTable::match(MatchTable *this,char *txt)

{
  pointer pMVar1;
  int *piVar2;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  long lVar4;
  int iVar5;
  long lVar7;
  pointer pMVar8;
  long lVar9;
  ulong uVar10;
  char cVar11;
  int state;
  vector<int,_std::allocator<int>_> curr_vec;
  allocator_type local_4d;
  value_type_conflict1 local_4c;
  vector<int,_std::allocator<int>_> local_48;
  ulong uVar6;
  
  local_4c = 1;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,
             (long)(this->regs).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->regs).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,&local_4c,&local_4d);
  cVar11 = *txt;
  if (cVar11 != '\0') {
    lVar4 = (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    pMVar1 = (this->tools).super__Vector_base<MatchTool,_std::allocator<MatchTool>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        lVar9 = 0;
        pMVar8 = pMVar1;
        do {
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar9] =
               *(int *)(*(long *)(*(long *)&(pMVar8->dtran).
                                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            ._M_impl +
                                 (long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start[lVar9] * 0x18) +
                       (long)cVar11 * 4);
          lVar9 = lVar9 + 1;
          pMVar8 = pMVar8 + 1;
        } while (lVar4 + (ulong)(lVar4 == 0) != lVar9);
      }
      cVar11 = txt[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (cVar11 != '\0');
  }
  uVar6 = 0xffffffff;
  iVar5 = -1;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar4 = 8;
    uVar10 = 0;
    do {
      local_4c = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar10];
      if (local_4c == 0) {
        cVar11 = '\n';
      }
      else {
        pMVar1 = (this->tools).super__Vector_base<MatchTool,_std::allocator<MatchTool>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar2 = *(int **)((long)&(pMVar1->dtran).
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl + lVar4 * 4);
        _Var3 = std::
                __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          (*(undefined8 *)((long)pMVar1 + lVar4 * 4 + -8),piVar2,&local_4c);
        cVar11 = _Var3._M_current != piVar2;
        if ((bool)cVar11) {
          uVar6 = uVar10 & 0xffffffff;
        }
      }
      iVar5 = (int)uVar6;
      if ((cVar11 != '\n') && (cVar11 != '\0')) goto LAB_00104a5a;
      uVar10 = uVar10 + 1;
      lVar4 = lVar4 + 0xc;
    } while (uVar10 < (ulong)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 2));
    iVar5 = -1;
  }
LAB_00104a5a:
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar5;
}

Assistant:

int MatchTable::match(const char *txt) const {
    std::vector<int> curr_vec(regs.size(), 1);
    for (int i = 0; txt[i] != '\0'; i++) {
        int ch = (int)txt[i];
        for (int j = 0; j < curr_vec.size(); j++) {
            curr_vec[j] = tools[j].dtran[curr_vec[j]][ch];
        }
    }
    for (int i = 0; i < curr_vec.size(); i++) {
        int state = curr_vec[i];
        if (state == 0) continue;
        std::vector<int>::const_iterator first = tools[i].targets.cbegin(),
                f,
                last = tools[i].targets.cend();
        if ((f = std::find(first, last, state)) != last) {
            return i;
        }
    }
    return -1;
}